

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O2

QString * QStandardPaths::writableLocation(QString *__return_storage_ptr__,StandardLocation type)

{
  char *pcVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QString *pQVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  __uid_t userId;
  int iVar10;
  ushort *puVar11;
  long lVar12;
  QString *pQVar13;
  int __oflag;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&> *this;
  QStringBuilder<QString,_QLatin1String> *this_00;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QStringView QVar14;
  qsizetype qStack_160;
  QStringView local_148;
  QRegularExpressionMatch match;
  QTextStream local_128;
  QLatin1StringView local_118;
  QFile local_108;
  undefined1 local_f8 [32];
  QStringBuilder<QString,_QLatin1String> local_d8;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&> local_a8;
  QArrayDataPointer<char16_t> local_78;
  QStringBuilder<QString,_QLatin1String> local_58;
  
  local_58.b.m_data = *(char **)(in_FS_OFFSET + 0x28);
  switch(type) {
  case TempLocation:
    if (*(char **)(in_FS_OFFSET + 0x28) == local_58.b.m_data) {
      QDir::tempPath();
      return __return_storage_ptr__;
    }
    goto LAB_003e7e2a;
  case HomeLocation:
    if (*(char **)(in_FS_OFFSET + 0x28) == local_58.b.m_data) {
      QDir::homePath();
      return __return_storage_ptr__;
    }
    goto LAB_003e7e2a;
  case AppLocalDataLocation:
  case GenericDataLocation:
  case AppDataLocation:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    bVar9 = isTestModeEnabled();
    if (bVar9) {
      QDir::homePath();
      qVar2 = local_58.a.d.size;
      pcVar4 = local_58.a.d.ptr;
      pDVar3 = local_58.a.d.d;
      local_58.a.d.d = (Data *)0x0;
      local_58.a.d.ptr = (char16_t *)0x0;
      local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      local_58.a.d.size = 0;
      local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
      local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      local_a8.a.b.m_data = "/.qttest/share";
      local_a8.a.b.m_size = 0xe;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                ((QString *)(local_f8 + 0x20),&local_a8.a);
LAB_003e6c96:
      pQVar13 = (QString *)(__return_storage_ptr__->d).d;
      pQVar5 = (QString *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_d8.a.d.d;
      (__return_storage_ptr__->d).ptr = local_d8.a.d.ptr;
      pcVar1 = (char *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_d8.a.d.size;
      local_d8.a.d.d = (Data *)pQVar13;
      local_d8.a.d.ptr = (char16_t *)pQVar5;
      local_d8.a.d.size = (qsizetype)pcVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_f8 + 0x20));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
    else {
      qEnvironmentVariable((QString *)&local_a8,"XDG_DATA_HOME");
      pDVar3 = (__return_storage_ptr__->d).d;
      pcVar4 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d =
           (Data *)CONCAT44(local_a8.a.a.d.d._4_4_,local_a8.a.a.d.d._0_4_);
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(local_a8.a.a.d.ptr._4_4_,local_a8.a.a.d.ptr._0_4_);
      local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      qVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size =
           CONCAT44(local_a8.a.a.d.size._4_4_,(undefined4)local_a8.a.a.d.size);
      local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
      local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
      if (!bVar9) {
        QString::clear(__return_storage_ptr__);
      }
      if ((__return_storage_ptr__->d).size == 0) {
        QDir::homePath();
        qVar2 = local_58.a.d.size;
        pcVar4 = local_58.a.d.ptr;
        pDVar3 = local_58.a.d.d;
        local_58.a.d.d = (Data *)0x0;
        local_58.a.d.ptr = (char16_t *)0x0;
        local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
        local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
        local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
        local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
        local_58.a.d.size = 0;
        local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
        local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
        local_a8.a.b.m_data = "/.local/share";
        local_a8.a.b.m_size = 0xd;
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                  ((QString *)(local_f8 + 0x20),&local_a8.a);
        goto LAB_003e6c96;
      }
    }
    if ((type == AppDataLocation) || (type == AppLocalDataLocation)) {
      appendOrganizationAndApp(__return_storage_ptr__);
    }
    break;
  case CacheLocation:
  case GenericCacheLocation:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    bVar9 = isTestModeEnabled();
    if (bVar9) {
      QDir::homePath();
      qVar2 = local_58.a.d.size;
      pcVar4 = local_58.a.d.ptr;
      pDVar3 = local_58.a.d.d;
      local_58.a.d.d = (Data *)0x0;
      local_58.a.d.ptr = (char16_t *)0x0;
      local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      local_58.a.d.size = 0;
      local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
      local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      local_a8.a.b.m_data = "/.qttest/cache";
      local_a8.a.b.m_size = 0xe;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                ((QString *)(local_f8 + 0x20),&local_a8.a);
LAB_003e725e:
      pQVar13 = (QString *)(__return_storage_ptr__->d).d;
      pQVar5 = (QString *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_d8.a.d.d;
      (__return_storage_ptr__->d).ptr = local_d8.a.d.ptr;
      pcVar1 = (char *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_d8.a.d.size;
      local_d8.a.d.d = (Data *)pQVar13;
      local_d8.a.d.ptr = (char16_t *)pQVar5;
      local_d8.a.d.size = (qsizetype)pcVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_f8 + 0x20));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
    else {
      qEnvironmentVariable((QString *)&local_a8,"XDG_CACHE_HOME");
      pDVar3 = (__return_storage_ptr__->d).d;
      pcVar4 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d =
           (Data *)CONCAT44(local_a8.a.a.d.d._4_4_,local_a8.a.a.d.d._0_4_);
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(local_a8.a.a.d.ptr._4_4_,local_a8.a.a.d.ptr._0_4_);
      local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      qVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size =
           CONCAT44(local_a8.a.a.d.size._4_4_,(undefined4)local_a8.a.a.d.size);
      local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
      local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
      if (!bVar9) {
        QString::clear(__return_storage_ptr__);
      }
      if ((__return_storage_ptr__->d).size == 0) {
        QDir::homePath();
        qVar2 = local_58.a.d.size;
        pcVar4 = local_58.a.d.ptr;
        pDVar3 = local_58.a.d.d;
        local_58.a.d.d = (Data *)0x0;
        local_58.a.d.ptr = (char16_t *)0x0;
        local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
        local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
        local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
        local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
        local_58.a.d.size = 0;
        local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
        local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
        local_a8.a.b.m_data = "/.cache";
        local_a8.a.b.m_size = 7;
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                  ((QString *)(local_f8 + 0x20),&local_a8.a);
        goto LAB_003e725e;
      }
    }
    if (type == CacheLocation) {
      appendOrganizationAndApp(__return_storage_ptr__);
    }
    break;
  case RuntimeLocation:
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable(__return_storage_ptr__,"XDG_RUNTIME_DIR");
    bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
    if (!bVar9) {
      QString::clear(__return_storage_ptr__);
    }
    lVar12 = (__return_storage_ptr__->d).size;
    if ((lVar12 != 0) && (bVar9 = checkXdgRuntimeDir(__return_storage_ptr__), bVar9)) break;
    userId = geteuid();
    local_58.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::resolveUserName(&local_58.a,userId);
    QDir::tempPath();
    local_d8.a.d.size = local_f8._16_8_;
    local_d8.a.d.ptr = (char16_t *)local_f8._8_8_;
    local_d8.a.d.d = (Data *)local_f8._0_8_;
    local_f8._0_8_ = (QString *)0x0;
    local_f8._8_8_ = (QString *)0x0;
    local_f8._16_8_ = (char *)0x0;
    local_d8.b.m_size = 9;
    local_d8.b.m_data = "/runtime-";
    QStringBuilder<QString,_QLatin1String>::QStringBuilder
              (&local_a8.a,(QStringBuilder<QString,_QLatin1String> *)(local_f8 + 0x20));
    local_a8.b = &local_58.a;
    QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>::convertTo<QString>
              ((QString *)&local_78,&local_a8);
    pDVar3 = (__return_storage_ptr__->d).d;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_78.d;
    (__return_storage_ptr__->d).ptr = local_78.ptr;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_78.size;
    local_78.d = pDVar3;
    local_78.ptr = pcVar4;
    local_78.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_f8 + 0x20));
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
    if (lVar12 == 0) {
      local_a8.a.a.d.d._0_4_ = 2;
      local_a8.a.a.d.size._4_4_ = 0;
      local_a8.a.a.d.d._4_4_ = 0;
      local_a8.a.a.d.ptr._0_4_ = 0;
      local_a8.a.a.d.ptr._4_4_ = 0;
      local_a8.a.a.d.size._0_4_ = 0;
      local_a8.a.b.m_size = (qsizetype)"default";
      puVar11 = QString::utf16(__return_storage_ptr__);
      QMessageLogger::warning
                ((QMessageLogger *)&local_a8,
                 "QStandardPaths: XDG_RUNTIME_DIR not set, defaulting to \'%ls\'",puVar11);
    }
    bVar9 = checkXdgRuntimeDir(__return_storage_ptr__);
    if (!bVar9) {
      QString::clear(__return_storage_ptr__);
    }
    this_00 = &local_58;
    goto LAB_003e7a4e;
  case ConfigLocation:
  case GenericConfigLocation:
  case AppConfigLocation:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    bVar9 = isTestModeEnabled();
    if (bVar9) {
      QDir::homePath();
      qVar2 = local_58.a.d.size;
      pcVar4 = local_58.a.d.ptr;
      pDVar3 = local_58.a.d.d;
      local_58.a.d.d = (Data *)0x0;
      local_58.a.d.ptr = (char16_t *)0x0;
      local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      local_58.a.d.size = 0;
      local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
      local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      local_a8.a.b.m_data = "/.qttest/config";
      local_a8.a.b.m_size = 0xf;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                ((QString *)(local_f8 + 0x20),&local_a8.a);
LAB_003e6b7a:
      pQVar13 = (QString *)(__return_storage_ptr__->d).d;
      pQVar5 = (QString *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_d8.a.d.d;
      (__return_storage_ptr__->d).ptr = local_d8.a.d.ptr;
      pcVar1 = (char *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_d8.a.d.size;
      local_d8.a.d.d = (Data *)pQVar13;
      local_d8.a.d.ptr = (char16_t *)pQVar5;
      local_d8.a.d.size = (qsizetype)pcVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_f8 + 0x20));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
    else {
      qEnvironmentVariable((QString *)&local_a8,"XDG_CONFIG_HOME");
      pDVar3 = (__return_storage_ptr__->d).d;
      pcVar4 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d =
           (Data *)CONCAT44(local_a8.a.a.d.d._4_4_,local_a8.a.a.d.d._0_4_);
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(local_a8.a.a.d.ptr._4_4_,local_a8.a.a.d.ptr._0_4_);
      local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      qVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size =
           CONCAT44(local_a8.a.a.d.size._4_4_,(undefined4)local_a8.a.a.d.size);
      local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
      local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
      if (!bVar9) {
        QString::clear(__return_storage_ptr__);
      }
      if ((__return_storage_ptr__->d).size == 0) {
        QDir::homePath();
        qVar2 = local_58.a.d.size;
        pcVar4 = local_58.a.d.ptr;
        pDVar3 = local_58.a.d.d;
        local_58.a.d.d = (Data *)0x0;
        local_58.a.d.ptr = (char16_t *)0x0;
        local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
        local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
        local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
        local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
        local_58.a.d.size = 0;
        local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
        local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
        local_a8.a.b.m_data = "/.config";
        local_a8.a.b.m_size = 8;
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                  ((QString *)(local_f8 + 0x20),&local_a8.a);
        goto LAB_003e6b7a;
      }
    }
    if (type == AppConfigLocation) {
      appendOrganizationAndApp(__return_storage_ptr__);
    }
    break;
  default:
    pQVar13 = (QString *)(local_f8 + 0x20);
    local_d8.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable(pQVar13,"XDG_CONFIG_HOME");
    bVar9 = QString::startsWith(pQVar13,(QChar)0x2f,CaseSensitive);
    if (!bVar9) {
      QString::clear((QString *)(local_f8 + 0x20));
    }
    if ((char *)local_d8.a.d.size == (char *)0x0) {
      QDir::homePath();
      qVar2 = local_78.size;
      pcVar4 = local_78.ptr;
      pDVar3 = local_78.d;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      local_78.size = 0;
      local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
      local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      local_a8.a.b.m_data = "/.config";
      local_a8.a.b.m_size = 8;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_58.a,&local_a8.a);
      qVar2 = local_d8.a.d.size;
      pcVar4 = local_d8.a.d.ptr;
      pDVar3 = local_d8.a.d.d;
      local_d8.a.d.d = local_58.a.d.d;
      local_d8.a.d.ptr = local_58.a.d.ptr;
      local_58.a.d.d = pDVar3;
      local_58.a.d.ptr = pcVar4;
      local_d8.a.d.size = local_58.a.d.size;
      local_58.a.d.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
    local_108.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_108.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
         (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.a.d.ptr = (char16_t *)0xf;
    local_58.a.d.size = 0x53b651;
    local_58.a.d.d = (Data *)pQVar13;
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_a8,(QStringBuilder<QString_&,_QLatin1String> *)&local_58);
    QFile::QFile(&local_108,(QString *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    local_118.m_data = "DESKTOP";
    local_118.m_size = 7;
    switch((ulong)type) {
    case 0:
      break;
    case 1:
      local_118.m_data = "DOCUMENTS";
      local_118.m_size = 9;
      break;
    case 2:
    case 3:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
switchD_003e6e8a_caseD_2:
      local_118.m_size = 0;
      local_118.m_data = (char *)0x0;
      goto LAB_003e75de;
    case 4:
      local_118.m_data = "MUSIC";
      qStack_160 = 5;
      local_118.m_size = qStack_160;
      break;
    case 5:
      local_118.m_data = "VIDEOS";
      qStack_160 = 6;
      local_118.m_size = qStack_160;
      break;
    case 6:
      local_118.m_data = "PICTURES";
      local_118.m_size = 8;
      break;
    case 0xe:
      local_118.m_data = "DOWNLOAD";
      local_118.m_size = 8;
      break;
    default:
      if (type == PublicShareLocation) {
        local_118.m_data = "PUBLICSHARE";
        qStack_160 = 0xb;
        local_118.m_size = qStack_160;
      }
      else {
        if (type != TemplatesLocation) goto switchD_003e6e8a_caseD_2;
        local_118.m_data = "TEMPLATES";
        local_118.m_size = 9;
      }
    }
    bVar9 = isTestModeEnabled();
    if ((bVar9) || (iVar10 = QFile::open(&local_108,(char *)0x1,__oflag), (char)iVar10 == '\0')) {
LAB_003e75de:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      if (type < StateLocation) {
        pQVar13 = (QString *)
                  (*(code *)(&DAT_0053b4bc + *(int *)(&DAT_0053b4bc + (ulong)type * 4)))();
        return pQVar13;
      }
    }
    else {
      local_128._vptr_QTextStream = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d_ptr._M_t.
      super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
      super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
           (__uniq_ptr_data<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>,_true,_true>
           )&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream(&local_128,(QIODevice *)&local_108);
      if ((writableLocation(QStandardPaths::StandardLocation)::exp == '\0') &&
         (iVar10 = __cxa_guard_acquire(&writableLocation(QStandardPaths::StandardLocation)::exp),
         iVar10 != 0)) {
        Qt::Literals::StringLiterals::operator____s
                  ((QString *)&local_a8,L"^XDG_(.*)_DIR=(.*)$",0x13);
        QRegularExpression::QRegularExpression
                  (&writableLocation::exp,(QString *)&local_a8,(PatternOptions)0x0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
        __cxa_atexit(QRegularExpression::~QRegularExpression,&writableLocation::exp,&__dso_handle);
        __cxa_guard_release(&writableLocation(QStandardPaths::StandardLocation)::exp);
      }
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      while( true ) {
        bVar9 = QTextStream::atEnd(&local_128);
        if (bVar9) break;
        QTextStream::readLine(&local_58.a,&local_128,0);
        match.d.d.ptr =
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QRegularExpression::match
                  ((QRegularExpression *)&match,(QString *)&writableLocation::exp,
                   (qsizetype)&local_58,NormalMatch,(MatchOptions)0x0);
        bVar9 = QRegularExpressionMatch::hasMatch(&match);
        if (bVar9) {
          QVar14 = QRegularExpressionMatch::capturedView(&match,1);
          local_a8.a.a.d.d._0_4_ = (undefined4)QVar14.m_size;
          local_a8.a.a.d.d._4_4_ = QVar14.m_size._4_4_;
          local_a8.a.a.d.ptr._0_4_ = QVar14.m_data._0_4_;
          local_a8.a.a.d.ptr._4_4_ = QVar14.m_data._4_4_;
          bVar9 = ::comparesEqual(&local_118,(QStringView *)&local_a8);
          if (bVar9) {
            local_148.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
            local_148.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_148 = QRegularExpressionMatch::capturedView(&match,2);
            lVar12 = local_148.m_size;
            if (((2 < lVar12) && (*local_148.m_data == L'\"')) &&
               (local_148.m_data[lVar12 + -1] == L'\"')) {
              local_148 = QStringView::mid(&local_148,1,lVar12 + -2);
            }
            s.m_data = "$HOME";
            s.m_size = 5;
            bVar9 = QStringView::startsWith(&local_148,s,CaseSensitive);
            if (bVar9) {
              QDir::homePath();
              local_a8.a.b = (QLatin1String)QStringView::mid(&local_148,5,-1);
              uVar8 = local_f8._16_8_;
              uVar7 = local_f8._8_8_;
              uVar6 = local_f8._0_8_;
              local_f8._0_8_ = (QString *)0x0;
              local_f8._8_8_ = (QString *)0x0;
              local_f8._16_8_ = (char *)0x0;
              local_a8.a.a.d.d._0_4_ = (undefined4)uVar6;
              local_a8.a.a.d.d._4_4_ = SUB84(uVar6,4);
              local_a8.a.a.d.ptr._0_4_ = (undefined4)uVar7;
              local_a8.a.a.d.ptr._4_4_ = SUB84(uVar7,4);
              local_a8.a.a.d.size._0_4_ = (undefined4)uVar8;
              local_a8.a.a.d.size._4_4_ = SUB84(uVar8,4);
              QStringBuilder<QString,_QStringView>::convertTo<QString>
                        ((QString *)&local_78,(QStringBuilder<QString,_QStringView> *)&local_a8);
              pDVar3 = (__return_storage_ptr__->d).d;
              pcVar4 = (__return_storage_ptr__->d).ptr;
              (__return_storage_ptr__->d).d = local_78.d;
              (__return_storage_ptr__->d).ptr = local_78.ptr;
              qVar2 = (__return_storage_ptr__->d).size;
              (__return_storage_ptr__->d).size = local_78.size;
              local_78.d = pDVar3;
              local_78.ptr = pcVar4;
              local_78.size = qVar2;
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_a8);
              this = (QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&> *)
                     local_f8;
            }
            else {
              this = &local_a8;
              QStringView::toString((QString *)this,&local_148);
              pDVar3 = (Data *)CONCAT44(local_a8.a.a.d.d._4_4_,local_a8.a.a.d.d._0_4_);
              pcVar4 = (char16_t *)CONCAT44(local_a8.a.a.d.ptr._4_4_,local_a8.a.a.d.ptr._0_4_);
              local_a8.a.a.d.d._0_4_ = *(undefined4 *)&(__return_storage_ptr__->d).d;
              local_a8.a.a.d.d._4_4_ = *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4);
              local_a8.a.a.d.ptr._0_4_ = *(undefined4 *)&(__return_storage_ptr__->d).ptr;
              local_a8.a.a.d.ptr._4_4_ = *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4)
              ;
              (__return_storage_ptr__->d).d = pDVar3;
              (__return_storage_ptr__->d).ptr = pcVar4;
              qVar2 = (__return_storage_ptr__->d).size;
              (__return_storage_ptr__->d).size =
                   CONCAT44(local_a8.a.a.d.size._4_4_,(undefined4)local_a8.a.a.d.size);
              local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
              local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
            if ((1 < (ulong)(__return_storage_ptr__->d).size) &&
               (bVar9 = QString::endsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive), bVar9))
            {
              QString::chop(__return_storage_ptr__,1);
            }
          }
        }
        QRegularExpressionMatch::~QRegularExpressionMatch(&match);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      }
      if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
        QTextStream::~QTextStream(&local_128);
        goto LAB_003e75de;
      }
      QTextStream::~QTextStream(&local_128);
    }
    QFile::~QFile(&local_108);
    this_00 = (QStringBuilder<QString,_QLatin1String> *)(local_f8 + 0x20);
LAB_003e7a4e:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
    break;
  case StateLocation:
  case GenericStateLocation:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    bVar9 = isTestModeEnabled();
    if (bVar9) {
      QDir::homePath();
      qVar2 = local_58.a.d.size;
      pcVar4 = local_58.a.d.ptr;
      pDVar3 = local_58.a.d.d;
      local_58.a.d.d = (Data *)0x0;
      local_58.a.d.ptr = (char16_t *)0x0;
      local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      local_58.a.d.size = 0;
      local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
      local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      local_a8.a.b.m_data = "/.qttest/state";
      local_a8.a.b.m_size = 0xe;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                ((QString *)(local_f8 + 0x20),&local_a8.a);
LAB_003e7142:
      pQVar13 = (QString *)(__return_storage_ptr__->d).d;
      pQVar5 = (QString *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_d8.a.d.d;
      (__return_storage_ptr__->d).ptr = local_d8.a.d.ptr;
      pcVar1 = (char *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_d8.a.d.size;
      local_d8.a.d.d = (Data *)pQVar13;
      local_d8.a.d.ptr = (char16_t *)pQVar5;
      local_d8.a.d.size = (qsizetype)pcVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_f8 + 0x20));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
    else {
      qEnvironmentVariable((QString *)&local_a8,"XDG_STATE_HOME");
      pDVar3 = (__return_storage_ptr__->d).d;
      pcVar4 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d =
           (Data *)CONCAT44(local_a8.a.a.d.d._4_4_,local_a8.a.a.d.d._0_4_);
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(local_a8.a.a.d.ptr._4_4_,local_a8.a.a.d.ptr._0_4_);
      local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
      local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
      local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      qVar2 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size =
           CONCAT44(local_a8.a.a.d.size._4_4_,(undefined4)local_a8.a.a.d.size);
      local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
      local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
      if (!bVar9) {
        QString::clear(__return_storage_ptr__);
      }
      if ((__return_storage_ptr__->d).size == 0) {
        QDir::homePath();
        qVar2 = local_58.a.d.size;
        pcVar4 = local_58.a.d.ptr;
        pDVar3 = local_58.a.d.d;
        local_58.a.d.d = (Data *)0x0;
        local_58.a.d.ptr = (char16_t *)0x0;
        local_a8.a.a.d.d._0_4_ = SUB84(pDVar3,0);
        local_a8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
        local_a8.a.a.d.ptr._0_4_ = SUB84(pcVar4,0);
        local_a8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
        local_58.a.d.size = 0;
        local_a8.a.a.d.size._0_4_ = (undefined4)qVar2;
        local_a8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
        local_a8.a.b.m_data = "/.local/state";
        local_a8.a.b.m_size = 0xd;
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                  ((QString *)(local_f8 + 0x20),&local_a8.a);
        goto LAB_003e7142;
      }
    }
    if (type == StateLocation) {
      appendOrganizationAndApp(__return_storage_ptr__);
    }
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == local_58.b.m_data) {
    return __return_storage_ptr__;
  }
LAB_003e7e2a:
  __stack_chk_fail();
}

Assistant:

QString QStandardPaths::writableLocation(StandardLocation type)
{
    switch (type) {
    case HomeLocation:
        return QDir::homePath();
    case TempLocation:
        return QDir::tempPath();
    case CacheLocation:
    case GenericCacheLocation:
    {
        QString xdgCacheHome;
        if (isTestModeEnabled()) {
            xdgCacheHome = QDir::homePath() + "/.qttest/cache"_L1;
        } else {
            // http://standards.freedesktop.org/basedir-spec/basedir-spec-0.6.html
            xdgCacheHome = qEnvironmentVariable("XDG_CACHE_HOME");
            if (!xdgCacheHome.startsWith(u'/'))
                xdgCacheHome.clear(); // spec says relative paths should be ignored

            if (xdgCacheHome.isEmpty())
                xdgCacheHome = QDir::homePath() + "/.cache"_L1;
        }
        if (type == QStandardPaths::CacheLocation)
            appendOrganizationAndApp(xdgCacheHome);
        return xdgCacheHome;
    }
    case StateLocation:
    case GenericStateLocation:
    {
        QString xdgStateHome;
        if (isTestModeEnabled()) {
            xdgStateHome = QDir::homePath() + "/.qttest/state"_L1;
        } else {
            // http://standards.freedesktop.org/basedir-spec/basedir-spec-0.8.html
            xdgStateHome = qEnvironmentVariable("XDG_STATE_HOME");
            if (!xdgStateHome.startsWith(u'/'))
                xdgStateHome.clear(); // spec says relative paths should be ignored

            if (xdgStateHome.isEmpty())
                xdgStateHome = QDir::homePath() + "/.local/state"_L1;
        }
        if (type == QStandardPaths::StateLocation)
            appendOrganizationAndApp(xdgStateHome);
        return xdgStateHome;
    }
    case AppDataLocation:
    case AppLocalDataLocation:
    case GenericDataLocation:
    {
        QString xdgDataHome;
        if (isTestModeEnabled()) {
            xdgDataHome = QDir::homePath() + "/.qttest/share"_L1;
        } else {
            xdgDataHome = qEnvironmentVariable("XDG_DATA_HOME");
            if (!xdgDataHome.startsWith(u'/'))
                xdgDataHome.clear(); // spec says relative paths should be ignored

            if (xdgDataHome.isEmpty())
                xdgDataHome = QDir::homePath() + "/.local/share"_L1;
        }
        if (type == AppDataLocation || type == AppLocalDataLocation)
            appendOrganizationAndApp(xdgDataHome);
        return xdgDataHome;
    }
    case ConfigLocation:
    case GenericConfigLocation:
    case AppConfigLocation:
    {
        QString xdgConfigHome;
        if (isTestModeEnabled()) {
            xdgConfigHome = QDir::homePath() + "/.qttest/config"_L1;
        } else {
            // http://standards.freedesktop.org/basedir-spec/latest/
            xdgConfigHome = qEnvironmentVariable("XDG_CONFIG_HOME");
            if (!xdgConfigHome.startsWith(u'/'))
                xdgConfigHome.clear(); // spec says relative paths should be ignored

            if (xdgConfigHome.isEmpty())
                xdgConfigHome = QDir::homePath() + "/.config"_L1;
        }
        if (type == AppConfigLocation)
            appendOrganizationAndApp(xdgConfigHome);
        return xdgConfigHome;
    }
    case RuntimeLocation:
    {
        QString xdgRuntimeDir = qEnvironmentVariable("XDG_RUNTIME_DIR");
        if (!xdgRuntimeDir.startsWith(u'/'))
            xdgRuntimeDir.clear(); // spec says relative paths should be ignored

        bool fromEnv = !xdgRuntimeDir.isEmpty();
        if (xdgRuntimeDir.isEmpty() || !checkXdgRuntimeDir(xdgRuntimeDir)) {
            // environment variable not set or is set to something unsuitable
            const uint myUid = uint(geteuid());
            const QString userName = QFileSystemEngine::resolveUserName(myUid);
            xdgRuntimeDir = QDir::tempPath() + "/runtime-"_L1 + userName;

            if (!fromEnv) {
#ifndef Q_OS_WASM
                qWarning("QStandardPaths: XDG_RUNTIME_DIR not set, defaulting to '%ls'", qUtf16Printable(xdgRuntimeDir));
#endif
            }

            if (!checkXdgRuntimeDir(xdgRuntimeDir))
                xdgRuntimeDir.clear();
        }

        return xdgRuntimeDir;
    }
    default:
        break;
    }

#if QT_CONFIG(regularexpression)
    // http://www.freedesktop.org/wiki/Software/xdg-user-dirs
    QString xdgConfigHome = qEnvironmentVariable("XDG_CONFIG_HOME");
    if (!xdgConfigHome.startsWith(u'/'))
        xdgConfigHome.clear(); // spec says relative paths should be ignored

    if (xdgConfigHome.isEmpty())
        xdgConfigHome = QDir::homePath() + "/.config"_L1;
    QFile file(xdgConfigHome + "/user-dirs.dirs"_L1);
    const QLatin1StringView key = xdg_key_name(type);
    if (!key.isEmpty() && !isTestModeEnabled() && file.open(QIODevice::ReadOnly)) {
        QTextStream stream(&file);
        // Only look for lines like: XDG_DESKTOP_DIR="$HOME/Desktop"
        static const QRegularExpression exp(u"^XDG_(.*)_DIR=(.*)$"_s);
        QString result;
        while (!stream.atEnd()) {
            const QString &line = stream.readLine();
            QRegularExpressionMatch match = exp.match(line);
            if (match.hasMatch() && match.capturedView(1) == key) {
                QStringView value = match.capturedView(2);
                if (value.size() > 2
                    && value.startsWith(u'\"')
                    && value.endsWith(u'\"'))
                    value = value.mid(1, value.size() - 2);
                // value can start with $HOME
                if (value.startsWith("$HOME"_L1))
                    result = QDir::homePath() + value.mid(5);
                else
                    result = value.toString();
                if (result.size() > 1 && result.endsWith(u'/'))
                    result.chop(1);
            }
        }
        if (!result.isNull())
            return result;
    }
#endif // QT_CONFIG(regularexpression)

    QString path;
    switch (type) {
    case DesktopLocation:
        path = QDir::homePath() + "/Desktop"_L1;
        break;
    case DocumentsLocation:
        path = QDir::homePath() + "/Documents"_L1;
       break;
    case PicturesLocation:
        path = QDir::homePath() + "/Pictures"_L1;
        break;

    case FontsLocation:
        path = writableLocation(GenericDataLocation) + "/fonts"_L1;
        break;

    case MusicLocation:
        path = QDir::homePath() + "/Music"_L1;
        break;

    case MoviesLocation:
        path = QDir::homePath() + "/Videos"_L1;
        break;
    case DownloadLocation:
        path = QDir::homePath() + "/Downloads"_L1;
        break;
    case ApplicationsLocation:
        path = writableLocation(GenericDataLocation) + "/applications"_L1;
        break;

    case PublicShareLocation:
        path = QDir::homePath() + "/Public"_L1;
        break;

    case TemplatesLocation:
        path = QDir::homePath() + "/Templates"_L1;
        break;

    default:
        break;
    }

    return path;
}